

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O0

void GLPortal::EndFrame(void)

{
  bool doquery;
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 extraout_var;
  size_t sVar6;
  GLPortal *pGStack_10;
  bool usequery;
  GLPortal *p;
  
  if (gl_portalinfo) {
    pcVar4 = FString::GetChars(&::indent);
    uVar2 = TArray<GLPortal_*,_GLPortal_*>::Size(&portals);
    iVar3 = renderdepth;
    pcVar5 = FString::GetChars(&::indent);
    Printf("%s%d portals, depth = %d\n%s{\n",pcVar4,(ulong)uVar2,(ulong)(uint)iVar3,pcVar5);
    FString::operator+=(&::indent,"  ");
  }
  uVar2 = TArray<GLPortal_*,_GLPortal_*>::Size(&portals);
  doquery = renderdepth + 2U < uVar2;
  while (bVar1 = TArray<GLPortal_*,_GLPortal_*>::Pop(&portals,&stack0xfffffffffffffff0),
        bVar1 && pGStack_10 != (GLPortal *)0x0) {
    if ((gl_portalinfo & 1U) != 0) {
      pcVar4 = FString::GetChars(&::indent);
      iVar3 = (*pGStack_10->_vptr_GLPortal[7])();
      Printf("%sProcessing %s, depth = %d, query = %d\n",pcVar4,CONCAT44(extraout_var,iVar3),
             (ulong)(uint)renderdepth,(ulong)doquery);
    }
    uVar2 = TArray<GLWall,_GLWall>::Size(&pGStack_10->lines);
    if (uVar2 != 0) {
      RenderPortal(pGStack_10,true,doquery);
    }
    if (pGStack_10 != (GLPortal *)0x0) {
      (*pGStack_10->_vptr_GLPortal[1])();
    }
  }
  renderdepth = renderdepth + -1;
  if ((gl_portalinfo & 1U) != 0) {
    sVar6 = FString::Len(&::indent);
    FString::Truncate(&::indent,sVar6 - 2);
    pcVar4 = FString::GetChars(&::indent);
    Printf("%s}\n",pcVar4);
    uVar2 = TArray<GLPortal_*,_GLPortal_*>::Size(&portals);
    if (uVar2 == 0) {
      gl_portalinfo = false;
    }
  }
  return;
}

Assistant:

void GLPortal::EndFrame()
{
	GLPortal * p;

	if (gl_portalinfo)
	{
		Printf("%s%d portals, depth = %d\n%s{\n", indent.GetChars(), portals.Size(), renderdepth, indent.GetChars());
		indent += "  ";
	}

	// Only use occlusion query if there are more than 2 portals. 
	// Otherwise there's too much overhead.
	// (And don't forget to consider the separating NULL pointers!)
	bool usequery = portals.Size() > 2 + (unsigned)renderdepth;

	while (portals.Pop(p) && p)
	{
		if (gl_portalinfo) 
		{
			Printf("%sProcessing %s, depth = %d, query = %d\n", indent.GetChars(), p->GetName(), renderdepth, usequery);
		}
		if (p->lines.Size() > 0)
		{
			p->RenderPortal(true, usequery);
		}
		delete p;
	}
	renderdepth--;

	if (gl_portalinfo)
	{
		indent.Truncate(long(indent.Len()-2));
		Printf("%s}\n", indent.GetChars());
		if (portals.Size() == 0) gl_portalinfo = false;
	}
}